

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void __thiscall Process::handleInput(Process *this,int fd)

{
  ssize_t sVar1;
  int *piVar2;
  String *this_00;
  int iVar3;
  int iVar4;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  EventLoop::eventLoop();
  if ((EventLoop *)local_68._M_unused._0_8_ == (EventLoop *)0x0) {
    __assert_fail("EventLoop::eventLoop()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                  ,0x2ec,"void Process::handleInput(int)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  EventLoop::eventLoop();
  EventLoop::unregisterSocket((EventLoop *)local_68._M_unused._0_8_,fd);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  this_00 = (this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if ((this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur != this_00) {
    local_48 = &this->mStdInBuffer;
    iVar4 = this->mStdInIndex;
    do {
      iVar3 = (int)(this_00->mString)._M_string_length;
      if (iVar4 == 0) {
        while( true ) {
          sVar1 = ::write(fd,(this_00->mString)._M_dataplus._M_p,(long)iVar3);
          iVar4 = (int)sVar1;
          if (iVar4 != -1) break;
          piVar2 = __errno_location();
          if (*piVar2 != 4) goto LAB_001713a8;
        }
      }
      else {
        iVar3 = iVar3 - iVar4;
        while( true ) {
          String::mid((String *)&local_68,this_00,(long)this->mStdInIndex,0xffffffffffffffff);
          sVar1 = ::write(fd,local_68._M_unused._M_object,(long)iVar3);
          iVar4 = (int)sVar1;
          if ((EventLoop *)local_68._M_unused._0_8_ != (EventLoop *)&stack0xffffffffffffffa8) {
            operator_delete(local_68._M_unused._M_object);
          }
          if (iVar4 != -1) break;
          piVar2 = __errno_location();
          if (*piVar2 != 4) {
LAB_001713a8:
            EventLoop::eventLoop();
            local_68._8_8_ = 0;
            local_68._M_unused._M_object = operator_new(0x18);
            *(code **)local_68._M_unused._0_8_ = processCallback;
            *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
            *(Process **)((long)local_68._M_unused._0_8_ + 0x10) = this;
            local_50 = std::
                       _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                       ::_M_invoke;
            local_58 = std::
                       _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                       ::_M_manager;
            EventLoop::registerSocket
                      ((EventLoop *)local_40,fd,2,(function<void_(int,_unsigned_int)> *)&local_68);
            if ((element_type *)local_58 != (element_type *)0x0) {
              (*local_58)(&local_68,&local_68,3);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              return;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
            return;
          }
        }
      }
      if (iVar4 == iVar3) {
        std::deque<String,_std::allocator<String>_>::pop_front
                  ((deque<String,_std::allocator<String>_> *)local_48);
        iVar4 = 0;
        if (((this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur ==
             (this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur) && (this->mWantStdInClosed == true)) {
          EventLoop::eventLoop();
          EventLoop::unregisterSocket((EventLoop *)local_68._M_unused._0_8_,this->mStdIn[1]);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          }
          do {
            iVar3 = close(this->mStdIn[1]);
            if (iVar3 != -1) break;
            piVar2 = __errno_location();
          } while (*piVar2 == 4);
          this->mStdIn[1] = -1;
          this->mWantStdInClosed = false;
        }
      }
      else {
        iVar4 = iVar4 + this->mStdInIndex;
      }
      this->mStdInIndex = iVar4;
      this_00 = (this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
    } while ((this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur != this_00);
  }
  return;
}

Assistant:

void Process::handleInput(int fd)
{
    assert(EventLoop::eventLoop());
    EventLoop::eventLoop()->unregisterSocket(fd);

    //static int ting = 0;
    //printf("Process::handleInput (cnt=%d)\n", ++ting);
    for (;;) {
        if (mStdInBuffer.empty())
            return;

        //printf("Process::handleInput in loop\n");
        int w, want;
        const String &front = mStdInBuffer.front();
        if (mStdInIndex) {
            want = front.size() - mStdInIndex;
            eintrwrap(w, ::write(fd, front.mid(mStdInIndex).constData(), want));
        } else {
            want = front.size();
            eintrwrap(w, ::write(fd, front.constData(), want));
        }
        if (w == -1) {
            EventLoop::eventLoop()->registerSocket(fd, EventLoop::SocketWrite, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
            break;
        } else if (w == want) {
            mStdInBuffer.pop_front();
            if (mStdInBuffer.empty() && mWantStdInClosed) {
                EventLoop::eventLoop()->unregisterSocket(mStdIn[1]);
                int err;
                eintrwrap(err, ::close(mStdIn[1]));
                mStdIn[1] = -1;
                mWantStdInClosed = false;
            }
            mStdInIndex = 0;
        } else
            mStdInIndex += w;
    }
}